

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O0

void __thiscall TEST_MockSupportTest_tracing_Test::testBody(TEST_MockSupportTest_tracing_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  MockActualCall *pMVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  char *pcVar5;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockSupportTest_tracing_Test *local_10;
  TEST_MockSupportTest_tracing_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x23])(pMVar2,1);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(local_40,"");
  pMVar2 = mock(local_40,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_50);
  SimpleString::SimpleString(&local_60,"double");
  pMVar3 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var,iVar1),&local_60,1.0);
  SimpleString::SimpleString(&local_70,"int");
  pMVar3 = MockActualCall::withParameter(pMVar3,&local_70,1);
  SimpleString::SimpleString(&local_80,"string");
  MockActualCall::withParameter(pMVar3,&local_80,"string");
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(local_40);
  SimpleString::SimpleString(&local_90,"scope");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_b0,"double");
  pMVar3 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_00,iVar1),&local_b0,1.0);
  SimpleString::SimpleString(&local_c0,"int");
  pMVar3 = MockActualCall::withParameter(pMVar3,&local_c0,1);
  SimpleString::SimpleString(&local_d0,"string");
  MockActualCall::withParameter(pMVar3,&local_d0,"string");
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_e0,"");
  pMVar2 = mock(&local_e0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_e0);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_f0,"");
  pMVar2 = mock(&local_f0,(MockFailureReporter *)0x0);
  pcVar5 = MockSupport::getTraceOutput(pMVar2);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"boo",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x9b);
  SimpleString::~SimpleString(&local_f0);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_100,"");
  pMVar2 = mock(&local_100,(MockFailureReporter *)0x0);
  pcVar5 = MockSupport::getTraceOutput(pMVar2);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"foo",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x9c);
  SimpleString::~SimpleString(&local_100);
  return;
}

Assistant:

TEST(MockSupportTest, tracing)
{
    mock().tracing(true);

    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock("scope").actualCall("foo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().checkExpectations();

    STRCMP_CONTAINS("boo", mock().getTraceOutput());
    STRCMP_CONTAINS("foo", mock().getTraceOutput());
}